

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_match.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  App *this;
  App *this_00;
  Option *pOVar1;
  allocator<char> local_86b;
  allocator<char> local_86a;
  allocator<char> local_869;
  string local_868;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_848;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  Validator local_488;
  Validator local_420;
  Validator local_3b8;
  App args;
  
  spdlog::set_level(debug);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"Simple image matching utility.",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"",&local_86b);
  CLI::App::App(&args,&local_4a8,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4a8);
  args.require_subcommand_min_ = 1;
  args.require_subcommand_max_ = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"generate",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"Generate descriptor database.",&local_86b);
  this = CLI::App::add_subcommand(&args,&local_4e8,&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"match",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"Match an image against database.",&local_86b);
  this_00 = CLI::App::add_subcommand(&args,&local_528,&local_548);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"type",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"Type of descriptor to generate (32, 64, 128 or 256)",&local_86b);
  pOVar1 = CLI::App::add_option<unsigned_int,_unsigned_int,_(CLI::detail::enabler)0>
                     (this,&local_568,&app.type,&local_588,false);
  (pOVar1->super_OptionBase<CLI::Option>).required_ = true;
  local_828.super__Function_base._M_functor._8_8_ = 0;
  local_828.super__Function_base._M_functor._M_unused._M_object = check_type;
  local_828._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_828.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"",&local_869);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"",&local_86a);
  CLI::Option::check(pOVar1,&local_828,&local_5a8,&local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5a8);
  CLI::std::_Function_base::~_Function_base(&local_828.super__Function_base);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,"dataset",&local_86b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"Path to the directory containing images.",&local_869);
  pOVar1 = CLI::App::
           add_option<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_(CLI::detail::enabler)0>
                     (this,&local_5e8,&app.dataset,&local_608,false);
  (pOVar1->super_OptionBase<CLI::Option>).required_ = true;
  CLI::Validator::Validator(&local_3b8,(Validator *)CLI::ExistingDirectory);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"",&local_86a);
  CLI::Option::check(pOVar1,&local_3b8,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  CLI::Validator::~Validator(&local_3b8);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"-f,--force-regenerate",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"Force regenerate all descriptors.",&local_86b);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (this,&local_628,&app.force_regenerate,&local_648);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"image_path",&local_86b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_688,"Path of image to compare.",&local_869);
  pOVar1 = CLI::App::
           add_option<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_(CLI::detail::enabler)0>
                     (this_00,&local_668,&app.input_image_path,&local_688,false);
  (pOVar1->super_OptionBase<CLI::Option>).required_ = true;
  CLI::Validator::Validator(&local_420,(Validator *)CLI::ExistingFile);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"",&local_86a);
  CLI::Option::check(pOVar1,&local_420,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  CLI::Validator::~Validator(&local_420);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"dataset",&local_86b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,"Path to the directory containing images.",&local_869);
  pOVar1 = CLI::App::
           add_option<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_(CLI::detail::enabler)0>
                     (this_00,&local_6a8,&app.dataset,&local_6c8,false);
  (pOVar1->super_OptionBase<CLI::Option>).required_ = true;
  CLI::Validator::Validator(&local_488,(Validator *)CLI::ExistingDirectory);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"",&local_86a);
  CLI::Option::check(pOVar1,&local_488,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  CLI::Validator::~Validator(&local_488);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"-n,--number-of-matches",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"Number of matches to display, -1 for all. (default: 10)",
             &local_86b);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (this_00,&local_6e8,&app.matches_num,&local_708,false);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"-t,--type",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"Type of descriptor to generate (32, 64, 128 or 256)",&local_86b);
  pOVar1 = CLI::App::add_option<unsigned_int,_unsigned_int,_(CLI::detail::enabler)0>
                     (this_00,&local_728,&app.type,&local_748,false);
  local_848.super__Function_base._M_functor._8_8_ = 0;
  local_848.super__Function_base._M_functor._M_unused._M_object = check_type;
  local_848._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_848.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"",&local_869);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"",&local_86a);
  CLI::Option::check(pOVar1,&local_848,&local_768,&local_788);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_768);
  CLI::std::_Function_base::~_Function_base(&local_848.super__Function_base);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a8,"-q,--quiet",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c8,"Enable quiet mode.",&local_86b);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(this,&local_7a8,&app.quiet_mode,&local_7c8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"-q,--quiet",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_808,"Enable quiet mode.",&local_86b);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(this_00,&local_7e8,&app.quiet_mode,&local_808);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_7e8);
  CLI::App::parse(&args,argc,argv);
  if (app.quiet_mode == true) {
    spdlog::set_level(critical);
  }
  if (this->parsed_ != 0) {
    run_generate_subcommand();
  }
  if (this_00->parsed_ != 0) {
    run_match_subcommand();
  }
  CLI::App::~App(&args);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    // Set the default global log level to debug
    spdlog::set_level(spdlog::level::debug);

    // Parse command line arguments
    CLI::App args("Simple image matching utility.");
    args.require_subcommand(1);

    auto generate_sub =
      args.add_subcommand("generate", "Generate descriptor database.");
    auto match_sub =
      args.add_subcommand("match", "Match an image against database.");

    // Arguments for the generate subcommand
    generate_sub
      ->add_option(
        "type", app.type, "Type of descriptor to generate (32, 64, 128 or 256)")
      ->required(true)
      ->check(check_type);

    generate_sub
      ->add_option(
        "dataset", app.dataset, "Path to the directory containing images.")
      ->required()
      ->check(CLI::ExistingDirectory);

    generate_sub->add_flag("-f,--force-regenerate",
                           app.force_regenerate,
                           "Force regenerate all descriptors.");

    // Arguments for the match subcommand
    match_sub
      ->add_option(
        "image_path", app.input_image_path, "Path of image to compare.")
      ->required()
      ->check(CLI::ExistingFile);

    match_sub
      ->add_option(
        "dataset", app.dataset, "Path to the directory containing images.")
      ->required()
      ->check(CLI::ExistingDirectory);

    match_sub->add_option(
      "-n,--number-of-matches",
      app.matches_num,
      "Number of matches to display, -1 for all. (default: 10)");

    match_sub
      ->add_option("-t,--type",
                   app.type,
                   "Type of descriptor to generate (32, 64, 128 or 256)")
      ->check(check_type);

    // Common arguments for both commands
    generate_sub->add_flag("-q,--quiet", app.quiet_mode, "Enable quiet mode.");
    match_sub->add_flag("-q,--quiet", app.quiet_mode, "Enable quiet mode.");

    CLI11_PARSE(args, argc, argv);

    if (app.quiet_mode)
        spdlog::set_level(spdlog::level::critical);

    if (*generate_sub)
        try {
            run_generate_subcommand();
        } catch (std::runtime_error& e) {
            spdlog::critical(e.what());
            return EXIT_FAILURE;
        }

    if (*match_sub)
        try {
            run_match_subcommand();
        } catch (std::runtime_error& e) {
            spdlog::critical(e.what());
            return EXIT_FAILURE;
        }

    return EXIT_SUCCESS;
}